

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec.c
# Opt level: O0

bool_t ecCreateGroup(ec_o *ec,octet *xbase,octet *ybase,octet *order,size_t order_len,u32 cofactor,
                    void *stack)

{
  int iVar1;
  u64 *dest;
  void *in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  size_t in_R8;
  uint in_R9D;
  undefined4 in_stack_ffffffffffffffc8;
  bool_t local_4;
  
  dest = (u64 *)memNonZeroSize(in_RCX,in_R8);
  if (((dest == (u64 *)0x0) ||
      (*(long *)(*(long *)(in_RDI + 0x18) + 0x30) + 1U < (long)dest + 7U >> 3)) || (in_R9D == 0)) {
    local_4 = 0;
  }
  else {
    if (in_RSI == 0) {
      wwSetZero(*(word **)(in_RDI + 0x30),*(size_t *)(*(long *)(in_RDI + 0x18) + 0x30));
    }
    else {
      iVar1 = (**(code **)(*(long *)(in_RDI + 0x18) + 0x40))
                        (*(undefined8 *)(in_RDI + 0x30),in_RSI,*(undefined8 *)(in_RDI + 0x18),
                         order_len);
      if (iVar1 == 0) {
        return 0;
      }
    }
    if (in_RDX == 0) {
      wwSetZero((word *)(*(long *)(in_RDI + 0x30) + *(long *)(*(long *)(in_RDI + 0x18) + 0x30) * 8),
                *(size_t *)(*(long *)(in_RDI + 0x18) + 0x30));
    }
    else {
      iVar1 = (**(code **)(*(long *)(in_RDI + 0x18) + 0x40))
                        (*(long *)(in_RDI + 0x30) + *(long *)(*(long *)(in_RDI + 0x18) + 0x30) * 8,
                         in_RDX,*(undefined8 *)(in_RDI + 0x18),order_len);
      if (iVar1 == 0) {
        return 0;
      }
    }
    u64From(dest,(void *)CONCAT44(in_R9D,in_stack_ffffffffffffffc8),0x17d97d);
    wwSetZero((word *)(*(long *)(in_RDI + 0x38) + ((long)dest + 7U & 0xfffffffffffffff8)),
              (*(long *)(*(long *)(in_RDI + 0x18) + 0x30) + 1) - ((long)dest + 7U >> 3));
    *(ulong *)(in_RDI + 0x50) = (ulong)in_R9D;
    local_4 = 1;
  }
  return local_4;
}

Assistant:

bool_t ecCreateGroup(ec_o* ec, const octet xbase[], const octet ybase[], 
	const octet order[], size_t order_len, u32 cofactor, void* stack)
{
	ASSERT(ecIsOperable(ec));
	ASSERT(memIsValid(order, order_len));
	ASSERT(memIsNullOrValid(xbase, ec->f->no));
	ASSERT(memIsNullOrValid(ybase, ec->f->no));
	// корректное описание?
	order_len = memNonZeroSize(order, order_len);
	if (order_len == 0 || 
		W_OF_O(order_len) > ec->f->n + 1 ||
		cofactor == 0 || 
		(u32)(word)cofactor != cofactor)
		return FALSE;
	// установить базовую точку
	if (xbase == 0)
		qrSetZero(ecX(ec->base), ec->f);
	else if (!qrFrom(ecX(ec->base), xbase, ec->f, stack))
		return FALSE;
	if (ybase == 0)
		qrSetZero(ecY(ec->base, ec->f->n), ec->f);
	else if (!qrFrom(ecY(ec->base, ec->f->n), ybase, ec->f, stack))
		return FALSE;
	// установить порядок и кофактор
	wwFrom(ec->order, order, order_len);
	wwSetZero(ec->order + W_OF_O(order_len), 
		ec->f->n + 1 - W_OF_O(order_len));
	ec->cofactor = (word)cofactor;
	// все нормально
	return TRUE;
}